

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O2

string * __thiscall
(anonymous_namespace)::loadString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          *is,size_t len)

{
  vector<char,_std::allocator<char>_> tmp;
  allocator_type local_31;
  _Vector_base<char,_std::allocator<char>_> local_30;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_30,(size_type)is,&local_31);
  std::istream::read(*(char **)this,(long)local_30._M_impl.super__Vector_impl_data._M_start);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_30._M_impl.super__Vector_impl_data._M_start,
             local_30._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string loadString(std::unique_ptr<std::istream>& is, size_t len) {
  std::vector<char> tmp(len);
  is->read(tmp.data(), tmp.size());
  return std::string(tmp.data(), tmp.size());
}